

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void biffopen(bifcxdef *ctx,int argc)

{
  ushort uVar1;
  runsdef *prVar2;
  ushort *puVar3;
  appctxdef *paVar4;
  int iVar5;
  int iVar6;
  FILE *pFVar7;
  errcxdef *peVar8;
  byte bVar9;
  char *__modes;
  runcxdef *ctx_00;
  ulong uVar10;
  long num;
  biffildef *pbVar11;
  bool bVar12;
  char fname [4096];
  char newname [4096];
  char acStack_2038 [4096];
  char local_1038 [4104];
  
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  if (prVar2[-1].runstyp != '\x03') {
    peVar8 = ctx->bifcxrun->runcxerr;
LAB_0020ec22:
    peVar8->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  bifcstr(ctx,acStack_2038,0x1000,(ctx->bifcxrun->runcxsp->runsv).runsvstr);
  iVar5 = os_is_file_absolute(acStack_2038);
  if (iVar5 == 0) {
    os_build_full_path(local_1038,0x1000,ctx->bifcxrun->runcxgamepath,acStack_2038);
    strcpy(acStack_2038,local_1038);
  }
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x03') {
    peVar8 = ctx_00->runcxerr;
    goto LAB_0020ec22;
  }
  puVar3 = (ushort *)(ctx_00->runcxsp->runsv).runsvstr;
  uVar1 = *puVar3;
  if (uVar1 < 3) {
LAB_0020ebe6:
    ctx->bifcxrun->runcxerr->errcxptr->erraav[0].errastr = "fopen";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x400);
  }
  pbVar11 = ctx->bifcxfile;
  num = 0;
  while (pbVar11->fp != (osfildef *)0x0) {
    num = num + 1;
    pbVar11 = pbVar11 + 1;
    if (num == 10) {
LAB_0020ebcf:
      runpnil(ctx_00);
      return;
    }
  }
  bVar9 = (byte)puVar3[1];
  iVar5 = 0x77;
  if (bVar9 < 0x72) {
    if (bVar9 == 0x52) {
LAB_0020ea32:
      iVar5 = 0x72;
    }
    else if (bVar9 != 0x57) goto LAB_0020ebe6;
  }
  else if (bVar9 != 0x77) {
    if (bVar9 == 0x72) goto LAB_0020ea32;
    goto LAB_0020ebe6;
  }
  if (uVar1 == 3) {
    bVar12 = true;
LAB_0020eaa4:
    uVar10 = 0;
  }
  else {
    bVar12 = *(char *)((long)puVar3 + 3) != '+';
    iVar6 = (uint)uVar1 + (uint)bVar12 + -4;
    if (iVar6 < 1) goto LAB_0020eaa4;
    bVar9 = *(char *)((long)puVar3 + (4 - (ulong)(*(char *)((long)puVar3 + 3) != '+'))) + 0xbe;
    if (((0x32 < bVar9) || ((0x4000100040001U >> ((ulong)bVar9 & 0x3f) & 1) == 0)) ||
       (uVar10 = 0x4000000040000 >> (bVar9 & 0x3f), iVar6 != 1)) goto LAB_0020ebe6;
  }
  paVar4 = ctx->bifcxappctx;
  if ((paVar4 != (appctxdef *)0x0) &&
     (paVar4->get_io_safety_level != (_func_void_void_ptr_int_ptr_int_ptr *)0x0)) {
    (*paVar4->get_io_safety_level)
              (paVar4->io_safety_level_ctx,&ctx->bifcxsafetyr,&ctx->bifcxsafetyw);
    ctx_00 = ctx->bifcxrun;
  }
  iVar6 = os_is_file_in_dir(acStack_2038,ctx_00->runcxgamepath,1,0);
  if (iVar5 == 0x72) {
    if ((3 < ctx->bifcxsafetyr) || (1 < ctx->bifcxsafetyr && iVar6 == 0)) goto LAB_0020ebcb;
    if ((uVar10 & 1) != 0) {
      if (!bVar12) goto LAB_0020ebe6;
      __modes = "r";
      goto LAB_0020eb9f;
    }
    if (bVar12) {
      __modes = "rb";
      goto LAB_0020eb9f;
    }
    pFVar7 = (FILE *)osfoprwb(acStack_2038,4);
  }
  else {
    if (iVar5 != 0x77) goto LAB_0020ebe6;
    if ((2 < ctx->bifcxsafetyw) || (0 < ctx->bifcxsafetyw && iVar6 == 0)) goto LAB_0020ebcb;
    if ((uVar10 & 1) != 0) {
      if (bVar12) {
        __modes = "w";
        goto LAB_0020eb9f;
      }
      goto LAB_0020ebe6;
    }
    if (bVar12) {
      __modes = "wb";
    }
    else {
      __modes = "w+b";
    }
LAB_0020eb9f:
    pFVar7 = fopen(acStack_2038,__modes);
  }
  if (pFVar7 != (FILE *)0x0) {
    pbVar11->flags = (byte)~(byte)uVar10 & 1;
    pbVar11->fp = (osfildef *)pFVar7;
    runpnum(ctx->bifcxrun,num);
    return;
  }
LAB_0020ebcb:
  ctx_00 = ctx->bifcxrun;
  goto LAB_0020ebcf;
}

Assistant:

void biffopen(bifcxdef *ctx, int argc)
{
    char      fname[OSFNMAX];
    uchar    *p;
    uchar    *mode;
    int       modelen;
    int       fnum;
    osfildef *fp;
    int       bin_mode = TRUE;   /* flag: mode is binary (rather than text) */
    int       rw_mode = FALSE;     /* flag: both read and write are allowed */
    char      main_mode;                     /* 'r' for read, 'w' for write */
    int       in_same_dir;            /* flag: file is in current directory */
    appctxdef *appctx;
    
    bifcntargs(ctx, 2, argc);

    /* get the filename */
    p = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, fname, (size_t)sizeof(fname), p);

    /* 
     *   If it's a relative path, combine it with the game file path to form
     *   the absolute path.  This ensures that relative paths are always
     *   relative to the original working directory if the OS-level working
     *   directory has changed. 
     */
    if (!os_is_file_absolute(fname))
    {
        /* combine the game file path with the relative filename */
        char newname[OSFNMAX];
        os_build_full_path(newname, sizeof(newname),
                           ctx->bifcxrun->runcxgamepath, fname);

        /* replace the original filename with the full path */
        strcpy(fname, newname);
    }

    /* get the mode string */
    mode = runpopstr(ctx->bifcxrun);
    modelen = osrp2(mode) - 2;
    mode += 2;
    if (modelen < 1)
        goto bad_mode;

    /* allocate a filenum for the file */
    for (fnum = 0 ; fnum < BIFFILMAX ; ++fnum)
    {
        if (ctx->bifcxfile[fnum].fp == 0)
            break;
    }
    if (fnum == BIFFILMAX)
    {
        /* return nil to indicate failure */
        runpnil(ctx->bifcxrun);
        return;
    }

    /* parse the main mode */
    switch(*mode)
    {
    case 'w':
    case 'W':
        main_mode = 'w';
        break;

    case 'r':
    case 'R':
        main_mode = 'r';
        break;

    default:
        goto bad_mode;
    }

    /* skip the main mode, and check for a '+' flag */
    ++mode;
    --modelen;
    if (modelen > 0 && *mode == '+')
    {
        /* note the read/write mode */
        rw_mode = TRUE;

        /* skip the speciifer */
        ++mode;
        --modelen;
    }

    /* check for a binary/text specifier */
    if (modelen > 0)
    {
        switch(*mode)
        {
        case 'b':
        case 'B':
            bin_mode = TRUE;
            break;

        case 't':
        case 'T':
            bin_mode = FALSE;
            break;

        default:
            goto bad_mode;
        }

        /* skip the binary/text specifier */
        ++mode;
        --modelen;
    }

    /* it's an error if there's anything left unparsed */
    if (modelen > 0)
        goto bad_mode;

    /*
     *   If we have a host application context, and it provides a file
     *   safety level callback function, ask the host system for its
     *   current file safety level, which overrides our current setting.  
     */
    appctx = ctx->bifcxappctx;
    if (appctx != 0 && appctx->get_io_safety_level != 0)
    {
        /* 
         *   ask the host system for the current level, and override any
         *   setting we previously had 
         */
        (*appctx->get_io_safety_level)(
            appctx->io_safety_level_ctx,
            &ctx->bifcxsafetyr, &ctx->bifcxsafetyw);
    }

    /* 
     *   Check to see if the file is in the current working directory - if
     *   not, we may have to disallow the operation based on safety level
     *   settings.
     */
    in_same_dir = os_is_file_in_dir(
        fname, ctx->bifcxrun->runcxgamepath, TRUE, FALSE);

    /* check file safety settings */
    switch(main_mode)
    {
    case 'w':
        /* 
         *   writing - we must be at a safety level no higher than 2
         *   (read/write current directory) to write at all, and we must be
         *   level 0 to write a file that's not in the current directory 
         */
        if (ctx->bifcxsafetyw > 2
            || (!in_same_dir && ctx->bifcxsafetyw > 0))
        {
            /* this operation is not allowed - return failure */
            runpnil(ctx->bifcxrun);
            return;
        }
        break;

    case 'r':
        /*
         *   reading - we must be at a safety level no higher than 3 (read
         *   current directory) to read at all, and we must be at safety
         *   level 1 (read any directory) or lower to read a file that's not
         *   in the current directory 
         */
        if (ctx->bifcxsafetyr > 3
            || (!in_same_dir && ctx->bifcxsafetyr > 1))
        {
            /* this operation is not allowed - return failure */
            runpnil(ctx->bifcxrun);
            return;
        }
        break;

    default:
        /* 
         *   fail the operation, as a code maintenance measure to make
         *   sure that we add appropriate cases to this switch (even if
         *   merely to allow the operation unconditionally) in the event
         *   that more modes are added in the future 
         */
        goto bad_mode;
    }

    /* try opening the file */
    switch(main_mode)
    {
    case 'w':
        /* check for binary vs text mode */
        if (bin_mode)
        {
            /* 
             *   binary mode -- allow read/write or just writing, but in
             *   either case truncate the file if it already exists, and
             *   create a new file if it doesn't exist 
             */
            if (rw_mode)
                fp = osfoprwtb(fname, OSFTDATA);
            else
                fp = osfopwb(fname, OSFTDATA);
        }
        else
        {
            /* text mode - don't allow read/write on a text file */
            if (rw_mode)
                goto bad_mode;

            /* open the file */
            fp = osfopwt(fname, OSFTTEXT);
        }
        break;

    case 'r':
        /* check for binary vs text mode */
        if (bin_mode)
        {
            /*
             *   Binary mode -- allow read/write or just reading; leave
             *   any existing file intact.
             */
            if (rw_mode)
            {
                /* open for reading and writing, keeping existing data */
                fp = osfoprwb(fname, OSFTDATA);
            }
            else
            {
                /* open for read-only */
                fp = osfoprb(fname, OSFTDATA);
            }
        }
        else
        {
            /* text mode -- only allow reading */
            if (rw_mode)
                goto bad_mode;

            /* open the file */
            fp = osfoprt(fname, OSFTTEXT);
        }
        break;

    default:
        goto bad_mode;
    }

    /* if we couldn't open it, return nil */
    if (fp == 0)
    {
        runpnil(ctx->bifcxrun);
        return;
    }

    /* store the flags */
    ctx->bifcxfile[fnum].flags = 0;
    if (bin_mode)
        ctx->bifcxfile[fnum].flags |= BIFFIL_F_BINARY;

    /* remember the file handle */
    ctx->bifcxfile[fnum].fp = fp;

    /* return the file number (i.e., the slot number) */
    runpnum(ctx->bifcxrun, (long)fnum);
    return;


    /* come here on a mode error */
bad_mode:
    runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "fopen");
}